

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_varint.cpp
# Opt level: O0

void anon_unknown.dwarf_eddf3::VarInt::check
               (uint64_t test_value,initializer_list<unsigned_char> *il)

{
  initializer_list<unsigned_char> *x;
  bool bVar1;
  char *pcVar2;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> out;
  uchar *puVar3;
  unsigned_long *lhs;
  initializer_list<unsigned_char> xs;
  AssertHelper local_140;
  Message local_138;
  uint64_t local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_3;
  Message local_110;
  uint local_104;
  size_type local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_2;
  Message local_e0;
  testing *local_d8;
  iterator puStack_d0;
  ElementsAreArrayMatcher<unsigned_char> local_c0;
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_char>_> local_a8
  ;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  Message local_50 [3];
  uint local_34;
  size_type local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  initializer_list<unsigned_char> *il_local;
  uint64_t test_value_local;
  ElementsAreArrayMatcher<unsigned_char> *matcher;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )il;
  il_local = (initializer_list<unsigned_char> *)test_value;
  local_30 = std::initializer_list<unsigned_char>::size(il);
  local_34 = pstore::varint::encoded_size((uint64_t)il_local);
  lhs = &local_30;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_28,"il.size ()","pstore::varint::encoded_size (test_value)",lhs,
             &local_34);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    lhs = (unsigned_long *)0x27;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_varint.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_50);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  x = il_local;
  out = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::varint::
         encode<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                   ((uint64_t)x,out);
  local_d8 = *(testing **)
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
  puStack_d0 = *(iterator *)
                ((long)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl + 8);
  xs._M_len = (size_type)lhs;
  xs._M_array = puStack_d0;
  testing::ElementsAreArray<unsigned_char>(&local_c0,local_d8,xs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_char>>
            (&local_a8,(internal *)&local_c0,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_char>>::
  operator()(local_90,(char *)&local_a8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)"buffer");
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_char>_>::
  ~PredicateFormatterFromMatcher(&local_a8);
  testing::internal::ElementsAreArrayMatcher<unsigned_char>::~ElementsAreArrayMatcher(&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_varint.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_100 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  local_104 = pstore::varint::decode_size<unsigned_char*>(puVar3);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_f8,"buffer.size ()","pstore::varint::decode_size (buffer.data ())",
             &local_100,&local_104);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_varint.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  local_130 = pstore::varint::decode<unsigned_char*>(puVar3);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_128,"test_value","pstore::varint::decode (buffer.data ())",
             (unsigned_long *)&il_local,&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_varint.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  return;
}

Assistant:

static void check (std::uint64_t test_value,
                           std::initializer_list<std::uint8_t> const & il) {
            EXPECT_EQ (il.size (), pstore::varint::encoded_size (test_value));
            std::vector<std::uint8_t> buffer;
            pstore::varint::encode (test_value, std::back_inserter (buffer));
            EXPECT_THAT (buffer, ::testing::ElementsAreArray (il));
            EXPECT_EQ (buffer.size (), pstore::varint::decode_size (buffer.data ()));
            EXPECT_EQ (test_value, pstore::varint::decode (buffer.data ()));
        }